

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O1

int __thiscall FParser::FindOperatorBackwards(FParser *this,int start,int stop,char *value)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  
  lVar6 = 0xffffffff;
  if (start <= stop) {
    iVar4 = 0;
    lVar6 = (long)stop;
    do {
      if (this->TokenType[lVar6] == operator_) {
        cVar1 = *this->Tokens[lVar6];
        uVar5 = (uint)(cVar1 == ')');
        if (cVar1 == '(') {
          uVar5 = 0xffffffff;
        }
        iVar4 = iVar4 + uVar5;
        if (iVar4 == 0) {
          iVar3 = strcmp(value,this->Tokens[lVar6]);
          iVar4 = 0;
          if (iVar3 == 0) goto LAB_00512405;
        }
      }
      bVar2 = start < lVar6;
      lVar6 = lVar6 + -1;
    } while (bVar2);
    lVar6 = 0xffffffff;
  }
LAB_00512405:
  return (int)lVar6;
}

Assistant:

int FParser::FindOperatorBackwards(int start, int stop, const char *value)
{
	int i;
	int bracketlevel = 0;
	
	for(i=stop; i>=start; i--)      // check backwards
    {
		// operators only
		
		if(TokenType[i] != operator_) continue;
		
		// use bracketlevel to check the number of brackets
		// which we are inside
		
		bracketlevel += Tokens[i][0]=='(' ? -1 :
		Tokens[i][0]==')' ? 1 : 0;
		
		// only check when we are not in brackets
		// if we find what we want, return it
		
		if(!bracketlevel && !strcmp(value, Tokens[i]))
			return i;
    }
	
	return -1;
}